

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::EnsureLitbuf
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,CharCount size)

{
  uint uVar1;
  uint uVar2;
  Char *pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->litbufLen;
  if (uVar1 - this->litbufNext < size) {
    uVar4 = 0x10;
    if (0x10 < uVar1) {
      uVar4 = (ulong)uVar1;
    }
    do {
      uVar5 = uVar4;
      uVar2 = (uint)uVar5;
      uVar4 = (ulong)(uVar2 * 2);
    } while (uVar2 < this->litbufNext + size);
    pCVar3 = (Char *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     Realloc(&this->ctAllocator->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,this->litbuf,(ulong)uVar1 * 2,uVar5 * 2);
    this->litbuf = pCVar3;
    this->litbufLen = uVar2;
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::EnsureLitbuf(CharCount size)
    {
        if (litbufLen - litbufNext < size)
        {
            CharCount newLen = max(litbufLen, initLitbufSize);
            while (newLen < litbufNext + size)
                newLen *= 2;
            litbuf = (Char*)ctAllocator->Realloc(litbuf, litbufLen * sizeof(Char), newLen * sizeof(Char));
            litbufLen = newLen;
        }
    }